

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O2

void __thiscall
CNetAddr::Unserialize<ParamsStream<AutoFile&,CAddress::SerParams>>
          (CNetAddr *this,ParamsStream<AutoFile_&,_CAddress::SerParams> *s)

{
  long in_FS_OFFSET;
  
  if ((s->m_params->super_SerParams).enc == V2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      UnserializeV2Stream<ParamsStream<AutoFile&,CAddress::SerParams>>(this,s);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    UnserializeV1Stream<ParamsStream<AutoFile&,CAddress::SerParams>>(this,s);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        if (s.template GetParams<SerParams>().enc == Encoding::V2) {
            UnserializeV2Stream(s);
        } else {
            UnserializeV1Stream(s);
        }
    }